

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

LY_ERR lyd_validate_module(lyd_node **tree,lys_module *module,uint32_t val_opts,lyd_node **diff)

{
  lyd_node *plVar1;
  LY_ERR LVar2;
  char *pcVar3;
  ly_ctx *ctx;
  
  if (tree == (lyd_node **)0x0) {
    pcVar3 = "tree";
  }
  else if (module == (lys_module *)0x0) {
    pcVar3 = "module";
  }
  else {
    if ((val_opts & 2) == 0) {
      plVar1 = *tree;
      if (plVar1 != (lyd_node *)0x0) {
        if (plVar1->schema == (lysc_node *)0x0) {
          ctx = (ly_ctx *)plVar1[2].schema;
          if ((ctx == (ly_ctx *)0x0) || (ctx == module->ctx || module->ctx == (ly_ctx *)0x0))
          goto LAB_001aaa93;
        }
        else {
          ctx = plVar1->schema->module->ctx;
          if (((ctx == (ly_ctx *)0x0) || (module->ctx == (ly_ctx *)0x0)) || (ctx == module->ctx))
          goto LAB_001aaa93;
        }
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
        return LY_EINVAL;
      }
LAB_001aaa93:
      if (diff != (lyd_node **)0x0) {
        *diff = (lyd_node *)0x0;
      }
      LVar2 = lyd_validate(tree,module,module->ctx,val_opts,'\x01',(ly_set *)0x0,(ly_set *)0x0,
                           (ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,diff);
      return LVar2;
    }
    pcVar3 = "!(val_opts & 0x0002)";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,"lyd_validate_module"
        );
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_validate_module(struct lyd_node **tree, const struct lys_module *module, uint32_t val_opts, struct lyd_node **diff)
{
    LY_CHECK_ARG_RET(NULL, tree, module, !(val_opts & LYD_VALIDATE_PRESENT), LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(*tree ? LYD_CTX(*tree) : NULL, module->ctx, LY_EINVAL);
    if (diff) {
        *diff = NULL;
    }

    return lyd_validate(tree, module, module->ctx, val_opts, 1, NULL, NULL, NULL, NULL, NULL, diff);
}